

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFragDepthTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles3::Functional::FragDepthCompareCase::iterate(FragDepthCompareCase *this)

{
  RenderContext *pRVar1;
  code *pcVar2;
  void *pvVar3;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  undefined4 uVar7;
  int iVar8;
  int iVar9;
  undefined4 extraout_var;
  int *piVar11;
  NotSupportedError *this_00;
  TestError *pTVar12;
  uint x;
  char *description;
  long lVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  int iVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float varyingDepthCoord [16];
  Surface referenceFrame;
  float coord [8];
  float constDepthCoord [16];
  Surface renderedFrame;
  ProgramSources sources;
  ShaderProgram basicQuadProgram;
  Random rnd;
  long *local_330;
  long local_328;
  long local_320 [2];
  uint local_30c;
  undefined1 local_308 [8];
  undefined1 *puStack_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8;
  undefined8 local_2e8;
  ulong uStack_2e0;
  undefined1 *local_2d8;
  undefined8 uStack_2d0;
  Surface local_2c0;
  undefined1 local_2a8 [8];
  undefined1 **ppuStack_2a0;
  deUint16 *local_298;
  undefined1 *apuStack_290 [2];
  int local_280;
  TestLog *local_270;
  value_type local_268;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined1 *local_238;
  undefined8 uStack_230;
  Surface local_220;
  undefined1 local_208 [8];
  _Alloc_hider local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  int local_1e0;
  pointer local_1d8;
  pointer pbStack_1d0;
  int local_1c8;
  value_type *local_1c0;
  PrimitiveType local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  pointer pbStack_180;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_178;
  undefined1 local_158 [40];
  long *local_130;
  long local_128;
  long local_120 [2];
  undefined1 local_110 [152];
  deUint32 local_78;
  bool local_50;
  deRandom local_40;
  long lVar10;
  undefined4 extraout_var_00;
  
  local_270 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var,iVar5);
  dVar6 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deRandom_init(&local_40,dVar6);
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  piVar11 = (int *)CONCAT44(extraout_var_00,iVar5);
  iVar5 = *piVar11;
  iVar15 = 0x80;
  if (iVar5 < 0x80) {
    iVar15 = iVar5;
  }
  iVar8 = 0x80;
  if (piVar11[1] < 0x80) {
    iVar8 = piVar11[1];
  }
  dVar6 = deRandom_getUint32(&local_40);
  x = dVar6 % ((iVar5 - iVar15) + 1U);
  iVar5 = piVar11[1];
  dVar6 = deRandom_getUint32(&local_40);
  local_30c = dVar6 % ((iVar5 - iVar8) + 1U);
  tcu::Surface::Surface(&local_220,iVar15,iVar8);
  tcu::Surface::Surface(&local_2c0,iVar15,iVar8);
  if (piVar11[6] == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Depth buffer is required",glcts::fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragDepthTests.cpp"
               ,0x8a);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar10 + 0x1a00))(x,local_30c,iVar15,iVar8);
  (**(code **)(lVar10 + 0x188))(0x4500);
  (**(code **)(lVar10 + 0x5e0))(0xb71);
  pRVar1 = ((this->super_TestCase).m_context)->m_renderCtx;
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,
             "#version 300 es\nin highp vec4 a_position;\nin highp vec2 a_coord;\nout highp vec2 v_coord;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_coord = a_coord;\n}\n"
             ,"");
  local_308 = (undefined1  [8])&local_2f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_308,
             "#version 300 es\nuniform highp vec4 u_color;\nlayout(location = 0) out mediump vec4 o_color;\nvoid main (void)\n{\n\to_color = u_color;\n}\n"
             ,"");
  local_158[0x10] = 0;
  local_158._17_8_ = 0;
  local_158._0_8_ = (pointer)0x0;
  local_158[8] = 0;
  local_158._9_7_ = 0;
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_208,0,0xac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_208,&local_268);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1f0,(value_type *)local_308);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_110,pRVar1,(ProgramSources *)local_208);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_158);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_178);
  lVar13 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_208 + lVar13));
    lVar13 = lVar13 + -0x18;
  } while (lVar13 != -0x18);
  if (local_308 != (undefined1  [8])&local_2f8) {
    operator_delete((void *)local_308,local_2f8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if (local_50 == false) {
    glu::operator<<(local_270,(ShaderProgram *)local_110);
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar12,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragDepthTests.cpp"
               ,0x99);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_238 = (undefined1 *)0x3f80000000000000;
  uStack_230 = 0x3f8000003dcccccd;
  local_248 = 0xbf80000000000000;
  uStack_240 = 0x3f8000003dcccccd;
  local_268.field_2._M_allocated_capacity = 0x3f800000bf800000;
  local_268.field_2._8_8_ = 0x3f8000003dcccccd;
  local_268._M_dataplus._M_p = (pointer)0xbf800000bf800000;
  local_268._M_string_length = 0x3f8000003dcccccd;
  local_2d8 = &DAT_3f8000003f800000;
  uStack_2d0 = 0x3f800000bf800000;
  local_2e8 = 0xbf8000003f800000;
  uStack_2e0 = 0x3f80000000000000;
  local_2f8._M_allocated_capacity = 0x3f80000000000000;
  local_2f8._8_8_ = 0x3f80000000000000;
  local_308 = (undefined1  [8])0xbf80000000000000;
  puStack_300 = &DAT_3f8000003f800000;
  (**(code **)(lVar10 + 0x1680))(local_78);
  pcVar2 = *(code **)(lVar10 + 0x15a0);
  uVar7 = (**(code **)(lVar10 + 0xb48))(local_78,"u_color");
  (*pcVar2)(0,0,0x3f800000,0x3f800000,uVar7);
  (**(code **)(lVar10 + 0x4a0))(0x207);
  local_330 = local_320;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"a_position","");
  local_2a8._0_4_ = PRIMITIVETYPE_TRIANGLE_STRIP;
  ppuStack_2a0 = apuStack_290;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&ppuStack_2a0,local_330,local_328 + (long)local_330);
  local_280 = 0;
  local_208._0_4_ = local_2a8._0_4_;
  local_200._M_p = (pointer)&local_1f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_200,ppuStack_2a0,(long)local_298 + (long)ppuStack_2a0);
  local_1e0 = local_280;
  local_1d8 = (pointer)0x8;
  pbStack_1d0 = (pointer)0x400000004;
  local_1c8 = 0;
  local_1c0 = &local_268;
  if (ppuStack_2a0 != apuStack_290) {
    operator_delete(ppuStack_2a0,(ulong)((long)apuStack_290[0] + 1));
  }
  if (local_330 != local_320) {
    operator_delete(local_330,local_320[0] + 1);
  }
  local_2a8 = (undefined1  [8])0x600000000;
  ppuStack_2a0 = (undefined1 **)CONCAT44(ppuStack_2a0._4_4_,INDEXTYPE_UINT16);
  local_298 = iterate::quadIndices;
  glu::draw(((this->super_TestCase).m_context)->m_renderCtx,local_78,1,
            (VertexArrayBinding *)local_208,(PrimitiveList *)local_2a8,(DrawUtilCallback *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_p != &local_1f0) {
    operator_delete(local_200._M_p,local_1f0._M_allocated_capacity + 1);
  }
  local_330 = local_320;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"a_position","");
  local_2a8._0_4_ = PRIMITIVETYPE_TRIANGLE_STRIP;
  ppuStack_2a0 = apuStack_290;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&ppuStack_2a0,local_330,local_328 + (long)local_330);
  local_280 = 0;
  local_208._0_4_ = local_2a8._0_4_;
  local_200._M_p = (pointer)&local_1f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_200,ppuStack_2a0,(long)local_298 + (long)ppuStack_2a0);
  local_1e0 = local_280;
  local_1d8 = (pointer)0x8;
  pbStack_1d0 = (pointer)0x400000004;
  local_1c8 = 0;
  local_1c0 = (value_type *)local_308;
  if (ppuStack_2a0 != apuStack_290) {
    operator_delete(ppuStack_2a0,(ulong)((long)apuStack_290[0] + 1));
  }
  if (local_330 != local_320) {
    operator_delete(local_330,local_320[0] + 1);
  }
  local_2a8 = (undefined1  [8])0x600000000;
  ppuStack_2a0 = (undefined1 **)CONCAT44(ppuStack_2a0._4_4_,INDEXTYPE_UINT16);
  local_298 = iterate::quadIndices;
  glu::draw(((this->super_TestCase).m_context)->m_renderCtx,local_78,1,
            (VertexArrayBinding *)local_208,(PrimitiveList *)local_2a8,(DrawUtilCallback *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_p != &local_1f0) {
    operator_delete(local_200._M_p,local_1f0._M_allocated_capacity + 1);
  }
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"Draw base quads",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragDepthTests.cpp"
                  ,0xbb);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_110);
  pRVar1 = ((this->super_TestCase).m_context)->m_renderCtx;
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,
             "#version 300 es\nin highp vec4 a_position;\nin highp vec2 a_coord;\nout highp vec2 v_coord;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_coord = a_coord;\n}\n"
             ,"");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_308,(this->m_fragSrc)._M_dataplus._M_p,(allocator<char> *)local_2a8);
  local_158[0x10] = 0;
  local_158._17_8_ = 0;
  local_158._0_8_ = (pointer)0x0;
  local_158[8] = 0;
  local_158._9_7_ = 0;
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_208,0,0xac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_208,&local_268);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1f0,(value_type *)local_308);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_110,pRVar1,(ProgramSources *)local_208);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_158);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_178);
  lVar13 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_208 + lVar13));
    lVar13 = lVar13 + -0x18;
  } while (lVar13 != -0x18);
  if (local_308 != (undefined1  [8])&local_2f8) {
    operator_delete((void *)local_308,local_2f8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  glu::operator<<(local_270,(ShaderProgram *)local_110);
  if (local_50 == false) {
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar12,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragDepthTests.cpp"
               ,0xc4);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_298 = (deUint16 *)0x3f800000;
  apuStack_290[0] = &DAT_3f8000003f800000;
  local_2a8 = (undefined1  [8])0x0;
  ppuStack_2a0 = (undefined1 **)0x3f80000000000000;
  local_238 = &DAT_3f8000003f800000;
  uStack_230 = 0x3f800000bf800000;
  local_248 = 0xbf8000003f800000;
  uStack_240 = 0x3f80000000000000;
  local_268.field_2._M_allocated_capacity = 0x3f800000bf800000;
  local_268.field_2._8_8_ = 0x3f80000000000000;
  local_268._M_dataplus._M_p = (pointer)0xbf800000bf800000;
  local_268._M_string_length = (size_type)&DAT_3f8000003f800000;
  (**(code **)(lVar10 + 0x1680))(local_78);
  (**(code **)(lVar10 + 0x4a0))(this->m_compareFunc);
  pcVar2 = *(code **)(lVar10 + 0x15a0);
  uVar7 = (**(code **)(lVar10 + 0xb48))(local_78,"u_color");
  (*pcVar2)(0,0x3f800000,0,0x3f800000,uVar7);
  deqp::gls::setupDefaultUniforms(((this->super_TestCase).m_context)->m_renderCtx,local_78);
  local_330 = local_320;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"a_position","");
  local_308._0_4_ = 1;
  pvVar3 = (void *)((long)&local_2f8 + 8);
  puStack_300 = (undefined1 *)pvVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&puStack_300,local_330,local_328 + (long)local_330);
  uStack_2e0 = uStack_2e0 & 0xffffffff00000000;
  local_208._0_4_ = local_308._0_4_;
  local_200._M_p = (pointer)&local_1f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_200,puStack_300,(long)puStack_300 + local_2f8._M_allocated_capacity);
  local_1e0 = (int)uStack_2e0;
  local_1d8 = (pointer)0x8;
  pbStack_1d0 = (pointer)0x400000004;
  local_1c8 = 0;
  local_1c0 = &local_268;
  if (puStack_300 != (undefined1 *)pvVar3) {
    operator_delete(puStack_300,local_2f8._8_8_ + 1);
  }
  local_130 = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"a_coord","");
  local_308._0_4_ = 1;
  puStack_300 = (undefined1 *)pvVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&puStack_300,local_130,local_128 + (long)local_130);
  uStack_2e0 = uStack_2e0 & 0xffffffff00000000;
  local_1b8 = local_308._0_4_;
  pbVar14 = &local_1a0;
  local_1b0[0] = pbVar14;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1b0,puStack_300,(long)puStack_300 + local_2f8._M_allocated_capacity);
  local_1a0.field_2._M_allocated_capacity._0_4_ = (int)uStack_2e0;
  local_1a0.field_2._8_8_ = (pointer)0x8;
  pbStack_180 = (pointer)0x400000002;
  local_178.
  super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  local_178.
  super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)local_2a8;
  if (puStack_300 != (undefined1 *)pvVar3) {
    operator_delete(puStack_300,local_2f8._8_8_ + 1);
  }
  if (local_130 != local_120) {
    operator_delete(local_130,local_120[0] + 1);
  }
  if (local_330 != local_320) {
    operator_delete(local_330,local_320[0] + 1);
  }
  local_308 = (undefined1  [8])0x600000000;
  puStack_300 = (undefined1 *)CONCAT44(puStack_300._4_4_,1);
  local_2f8._M_allocated_capacity = (size_type)iterate::quadIndices;
  glu::draw(((this->super_TestCase).m_context)->m_renderCtx,local_78,2,
            (VertexArrayBinding *)local_208,(PrimitiveList *)local_308,(DrawUtilCallback *)0x0);
  lVar13 = -0xa0;
  do {
    if (pbVar14 !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        pbVar14[-1].field_2._M_allocated_capacity) {
      operator_delete((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      pbVar14[-1].field_2._M_allocated_capacity,
                      (ulong)((pbVar14->_M_dataplus)._M_p + 1));
    }
    pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &pbVar14[-3].field_2;
    lVar13 = lVar13 + 0x50;
  } while (lVar13 != 0);
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"Draw test quad",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragDepthTests.cpp"
                  ,0xe6);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_110);
  pRVar1 = ((this->super_TestCase).m_context)->m_renderCtx;
  local_208._0_4_ = RGBA;
  local_208._4_4_ = UNORM_INT8;
  if ((void *)local_220.m_pixels.m_cap != (void *)0x0) {
    local_220.m_pixels.m_cap = (size_t)local_220.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_110,(TextureFormat *)local_208,local_220.m_width,
             local_220.m_height,1,(void *)local_220.m_pixels.m_cap);
  glu::readPixels(pRVar1,x,local_30c,(PixelBufferAccess *)local_110);
  if (0 < local_2c0.m_height) {
    iVar5 = 0;
    do {
      iVar8 = (int)((float)local_2c0.m_width * 0.5 + 0.5);
      fVar17 = ((float)iVar5 + 0.5) / (float)local_2c0.m_height;
      iVar15 = local_2c0.m_width;
      if (iVar8 < local_2c0.m_width) {
        iVar15 = iVar8;
      }
      if (iVar8 < 0) {
        iVar15 = 0;
      }
      if (0 < iVar15) {
        iVar8 = 0;
        do {
          local_110._0_4_ = ((float)iVar8 + 0.5) / (float)local_2c0.m_width;
          local_110._4_4_ = fVar17;
          fVar16 = (*this->m_evalFunc)((Vec2 *)local_110);
          switch(this->m_compareFunc) {
          case 0x201:
            bVar4 = 0.55 < fVar16;
            goto LAB_012d3375;
          case 0x202:
            bVar4 = fVar16 == 0.55;
            break;
          case 0x203:
            bVar4 = 0.55 < fVar16;
            goto LAB_012d3397;
          case 0x204:
            bVar4 = fVar16 < 0.55;
LAB_012d3375:
            bVar4 = !bVar4 && fVar16 != 0.55;
            break;
          case 0x205:
            bVar4 = fVar16 != 0.55;
            break;
          case 0x206:
            bVar4 = fVar16 < 0.55;
LAB_012d3397:
            bVar4 = !bVar4;
            break;
          case 0x207:
            bVar4 = true;
            break;
          default:
            bVar4 = false;
          }
          uVar7 = 0xffff0000;
          if (bVar4) {
            uVar7 = 0xff00ff00;
          }
          *(undefined4 *)
           ((long)local_2c0.m_pixels.m_ptr + (long)(local_2c0.m_width * iVar5 + iVar8) * 4) = uVar7;
          iVar8 = iVar8 + 1;
        } while (iVar15 != iVar8);
      }
      if (iVar15 < local_2c0.m_width) {
        iVar8 = 0;
        do {
          iVar9 = local_2c0.m_width;
          local_110._0_4_ = ((float)(iVar15 + iVar8) + 0.5) / (float)local_2c0.m_width;
          local_110._4_4_ = fVar17;
          fVar16 = (*this->m_evalFunc)((Vec2 *)local_110);
          if (6 < this->m_compareFunc - 0x201) {
            bVar4 = false;
            goto LAB_012d34c7;
          }
          fVar18 = 1.0 - (((float)iVar8 + 0.5) / (float)(iVar9 - iVar15) + fVar17) * 0.5;
          switch(this->m_compareFunc) {
          case 0x201:
            bVar4 = fVar18 < fVar16;
            goto LAB_012d34a6;
          case 0x202:
            bVar4 = fVar16 == fVar18;
            break;
          case 0x203:
            bVar4 = fVar18 < fVar16;
            goto LAB_012d34c0;
          case 0x204:
            bVar4 = fVar16 < fVar18;
LAB_012d34a6:
            bVar4 = !bVar4 && fVar16 != fVar18;
            break;
          case 0x205:
            bVar4 = fVar16 != fVar18;
            break;
          case 0x206:
            bVar4 = fVar16 < fVar18;
LAB_012d34c0:
            bVar4 = !bVar4;
            break;
          case 0x207:
            bVar4 = true;
          }
LAB_012d34c7:
          uVar7 = 0xffff0000;
          if (bVar4) {
            uVar7 = 0xff00ff00;
          }
          *(undefined4 *)
           ((long)local_2c0.m_pixels.m_ptr + (long)(iVar15 + iVar8 + local_2c0.m_width * iVar5) * 4)
               = uVar7;
          iVar9 = iVar15 + iVar8;
          iVar8 = iVar8 + 1;
        } while (iVar9 + 1 < local_2c0.m_width);
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < local_2c0.m_height);
  }
  bVar4 = tcu::fuzzyCompare(local_270,"Result","Image comparison result",&local_2c0,&local_220,0.05,
                            COMPARE_LOG_RESULT);
  description = "Fail";
  if (bVar4) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar4,description
            );
  tcu::Surface::~Surface(&local_2c0);
  tcu::Surface::~Surface(&local_220);
  return STOP;
}

Assistant:

FragDepthCompareCase::IterateResult FragDepthCompareCase::iterate (void)
{
	TestLog&					log				= m_testCtx.getLog();
	const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
	de::Random					rnd				(deStringHash(getName()));
	const tcu::RenderTarget&	renderTarget	= m_context.getRenderContext().getRenderTarget();
	int							viewportW		= de::min(128, renderTarget.getWidth());
	int							viewportH		= de::min(128, renderTarget.getHeight());
	int							viewportX		= rnd.getInt(0, renderTarget.getWidth()-viewportW);
	int							viewportY		= rnd.getInt(0, renderTarget.getHeight()-viewportH);
	tcu::Surface				renderedFrame	(viewportW, viewportH);
	tcu::Surface				referenceFrame	(viewportW, viewportH);
	const float					constDepth		= 0.1f;

	if (renderTarget.getDepthBits() == 0)
		throw tcu::NotSupportedError("Depth buffer is required", "", __FILE__, __LINE__);

	gl.viewport(viewportX, viewportY, viewportW, viewportH);
	gl.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);
	gl.enable(GL_DEPTH_TEST);

	static const deUint16 quadIndices[] = { 0, 1, 2, 2, 1, 3 };

	// Fill viewport with 2 quads - one with constant depth and another with d = [-1..1]
	{
		glu::ShaderProgram basicQuadProgram(m_context.getRenderContext(), glu::makeVtxFragSources(s_vertexShaderSrc, s_defaultFragmentShaderSrc));

		if (!basicQuadProgram.isOk())
		{
			log << basicQuadProgram;
			TCU_FAIL("Compile failed");
		}

		const float constDepthCoord[] =
		{
			-1.0f, -1.0f, constDepth, 1.0f,
			-1.0f, +1.0f, constDepth, 1.0f,
			 0.0f, -1.0f, constDepth, 1.0f,
			 0.0f, +1.0f, constDepth, 1.0f
		};
		const float varyingDepthCoord[] =
		{
			 0.0f, -1.0f, +1.0f, 1.0f,
			 0.0f, +1.0f,  0.0f, 1.0f,
			+1.0f, -1.0f,  0.0f, 1.0f,
			+1.0f, +1.0f, -1.0f, 1.0f
		};

		gl.useProgram(basicQuadProgram.getProgram());
		gl.uniform4f(gl.getUniformLocation(basicQuadProgram.getProgram(), "u_color"), 0.0f, 0.0f, 1.0f, 1.0f);
		gl.depthFunc(GL_ALWAYS);

		{
			glu::VertexArrayBinding posBinding = glu::va::Float("a_position", 4, 4, 0, &constDepthCoord[0]);
			glu::draw(m_context.getRenderContext(), basicQuadProgram.getProgram(), 1, &posBinding,
					  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(quadIndices), &quadIndices[0]));
		}

		{
			glu::VertexArrayBinding posBinding = glu::va::Float("a_position", 4, 4, 0, &varyingDepthCoord[0]);
			glu::draw(m_context.getRenderContext(), basicQuadProgram.getProgram(), 1, &posBinding,
					  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(quadIndices), &quadIndices[0]));
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw base quads");
	}

	// Render with depth test.
	{
		glu::ShaderProgram program(m_context.getRenderContext(), glu::makeVtxFragSources(s_vertexShaderSrc, m_fragSrc.c_str()));
		log << program;

		if (!program.isOk())
			TCU_FAIL("Compile failed");

		const float coord[] =
		{
			0.0f, 0.0f,
			0.0f, 1.0f,
			1.0f, 0.0f,
			1.0f, 1.0f
		};
		const float position[] =
		{
			-1.0f, -1.0f, +1.0f, 1.0f,
			-1.0f, +1.0f,  0.0f, 1.0f,
			+1.0f, -1.0f,  0.0f, 1.0f,
			+1.0f, +1.0f, -1.0f, 1.0f
		};

		gl.useProgram(program.getProgram());
		gl.depthFunc(m_compareFunc);
		gl.uniform4f(gl.getUniformLocation(program.getProgram(), "u_color"), 0.0f, 1.0f, 0.0f, 1.0f);

		// Setup default helper uniforms.
		gls::setupDefaultUniforms(m_context.getRenderContext(), program.getProgram());

		{
			glu::VertexArrayBinding vertexArrays[] =
			{
				glu::va::Float("a_position",	4, 4, 0, &position[0]),
				glu::va::Float("a_coord",		2, 4, 0, &coord[0])
			};
			glu::draw(m_context.getRenderContext(), program.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), &vertexArrays[0],
					  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(quadIndices), &quadIndices[0]));
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw test quad");
	}

	glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, renderedFrame.getAccess());

	// Render reference.
	for (int y = 0; y < referenceFrame.getHeight(); y++)
	{
		float	yf		= ((float)y + 0.5f) / (float)referenceFrame.getHeight();
		int		half	= de::clamp((int)((float)referenceFrame.getWidth()*0.5f + 0.5f), 0, referenceFrame.getWidth());

		// Fill left half - comparison to constant 0.5
		for (int x = 0; x < half; x++)
		{
			float	xf		= ((float)x + 0.5f) / (float)referenceFrame.getWidth();
			float	d		= m_evalFunc(Vec2(xf, yf));
			bool	dpass	= compare(m_compareFunc, d, constDepth*0.5f + 0.5f);

			referenceFrame.setPixel(x, y, dpass ? tcu::RGBA::green() : tcu::RGBA::blue());
		}

		// Fill right half - comparison to interpolated depth
		for (int x = half; x < referenceFrame.getWidth(); x++)
		{
			float	xf		= ((float)x + 0.5f) / (float)referenceFrame.getWidth();
			float	xh		= ((float)(x - half) + 0.5f) / (float)(referenceFrame.getWidth()-half);
			float	rd		= 1.0f - (xh + yf) * 0.5f;
			float	d		= m_evalFunc(Vec2(xf, yf));
			bool	dpass	= compare(m_compareFunc, d, rd);

			referenceFrame.setPixel(x, y, dpass ? tcu::RGBA::green() : tcu::RGBA::blue());
		}
	}

	bool isOk = tcu::fuzzyCompare(log, "Result", "Image comparison result", referenceFrame, renderedFrame, 0.05f, tcu::COMPARE_LOG_RESULT);
	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							isOk ? "Pass"				: "Fail");
	return STOP;
}